

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  FunctionPrototypeSyntax *args_2;
  FunctionPrototypeSyntax *args_3;
  ClassMethodPrototypeSyntax *pCVar1;
  Token TVar2;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000070;
  BumpAllocator *in_stack_00000078;
  TokenList *in_stack_00000080;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000070,in_stack_00000068);
  args_2 = (FunctionPrototypeSyntax *)deepClone(in_stack_00000080,in_stack_00000078);
  not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator*
            ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0xa2eab9);
  args_3 = deepClone<slang::syntax::FunctionPrototypeSyntax>
                     ((FunctionPrototypeSyntax *)__child_stack,in_stack_ffffffffffffffb8);
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ClassMethodPrototypeSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::TokenList&,slang::syntax::FunctionPrototypeSyntax&,slang::parsing::Token>
                     (this,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)TVar2.info,
                      TVar2._0_8_,args_2,(Token *)args_3);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ClassMethodPrototypeSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ClassMethodPrototypeSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone(node.qualifiers, alloc),
        *deepClone<FunctionPrototypeSyntax>(*node.prototype, alloc),
        node.semi.deepClone(alloc)
    );
}